

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O2

_Bool al_set_mouse_axis(int which,int value)

{
  _Bool _Var1;
  
  if (which - 2U < 6) {
    _Var1 = (*new_mouse_driver->set_mouse_axis)(which,value);
    return _Var1;
  }
  return false;
}

Assistant:

bool al_set_mouse_axis(int which, int value)
{
   ASSERT(new_mouse_driver);
   ASSERT(new_mouse_driver->set_mouse_axis);
   ASSERT(which >= 2);
   ASSERT(which < 4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES);

   if (which >= 2 && which < 4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES)
      return new_mouse_driver->set_mouse_axis(which, value);
   else
      return false;
}